

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::SurfOffsetRegister::sim_write
          (SurfOffsetRegister *this,pgraph_state *state,uint32_t val)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  uint32_t val_local;
  pgraph_state *state_local;
  SurfOffsetRegister *this_local;
  
  uVar1 = (this->super_IndexedMmioRegister<9>).super_MmioRegister.super_Register.mask;
  iVar3 = (*(this->super_IndexedMmioRegister<9>).super_MmioRegister.super_Register._vptr_Register[3]
          )(this,state);
  *(uint32_t *)CONCAT44(extraout_var,iVar3) = val & uVar1;
  state->valid[0] = state->valid[0] & 0xfffffff7 | 8;
  if ((0x1f < (state->chipset).card_type) && (-1 < (long)((ulong)state->surf_unk880 << 0x2b))) {
    state->surf_unk888 =
         state->surf_unk888 &
         ((uint)(1L << ((byte)(this->super_IndexedMmioRegister<9>).idx & 0x3e)) ^ 0xffffffff) |
         (uint)(0L << ((byte)(this->super_IndexedMmioRegister<9>).idx & 0x3e));
    state->surf_unk888 =
         state->surf_unk888 &
         ((uint)(1L << ((byte)(this->super_IndexedMmioRegister<9>).idx & 0x3f | 1)) ^ 0xffffffff) |
         (uint)(0L << ((byte)(this->super_IndexedMmioRegister<9>).idx & 0x3f | 1));
    bVar2 = ::nv04_pgraph_is_nv25p(&state->chipset);
    if (bVar2) {
      state->surf_unk89c =
           state->surf_unk89c &
           ((uint)(0xfL << ((byte)(((this->super_IndexedMmioRegister<9>).idx & 0xfffffffeU) << 2) &
                           0x3f)) ^ 0xffffffff) |
           (uint)(0L << ((byte)(((this->super_IndexedMmioRegister<9>).idx & 0xfffffffeU) << 2) &
                        0x3f));
      state->surf_unk89c =
           state->surf_unk89c &
           ((uint)(0xfL << ((byte)(((this->super_IndexedMmioRegister<9>).idx | 1U) << 2) & 0x3f)) ^
           0xffffffff) |
           (uint)(0L << ((byte)(((this->super_IndexedMmioRegister<9>).idx | 1U) << 2) & 0x3f));
    }
  }
  return;
}

Assistant:

void sim_write(struct pgraph_state *state, uint32_t val) override {
		ref(state) = val & mask;
		insrt(state->valid[0], 3, 1, 1);
		if (state->chipset.card_type >= 0x20 && !extr(state->surf_unk880, 20, 1)) {
			insrt(state->surf_unk888, idx & ~1, 1, 0);
			insrt(state->surf_unk888, idx | 1, 1, 0);
			if (nv04_pgraph_is_nv25p(&state->chipset)) {
				insrt(state->surf_unk89c, (idx & ~1) * 4, 4, 0);
				insrt(state->surf_unk89c, (idx | 1) * 4, 4, 0);
			}
		}
	}